

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

void proxy_close(proxy_handle *ph)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  plVar1 = (long *)ph->priv;
  iVar2 = registration_service_stop((registration_service_handle *)(plVar1 + 0x111));
  if (iVar2 < 0) {
    pcVar3 = strerror(-iVar2);
    proxy_log(ph,LOG_LEVEL_ERROR,"Failed to stop registration service (%d): %s\n",
              (ulong)(uint)-iVar2,pcVar3);
  }
  proxy_shutdown(ph);
  proxy_drop(ph);
  lVar6 = 0;
  proxy_log(ph,LOG_LEVEL_DEBUG,"Closing client connections...\n");
  plVar1[0x104] = 0;
  for (lVar5 = 0; uVar4 = (ulong)(int)plVar1[0x107], lVar5 < (long)uVar4; lVar5 = lVar5 + 1) {
    proxy_worker_free((proxy_worker *)(plVar1[0x103] + lVar6));
    lVar6 = lVar6 + 0x50;
  }
  lVar6 = 0;
  memset(plVar1 + 1,0,0x810);
  for (lVar5 = 0; lVar5 < (int)uVar4; lVar5 = lVar5 + 1) {
    proxy_conn_free((proxy_conn_handle *)(*plVar1 + lVar6));
    uVar4 = (ulong)*(uint *)(plVar1 + 0x107);
    lVar6 = lVar6 + 0x48;
  }
  free((void *)plVar1[0x103]);
  plVar1[0x103] = 0;
  free((void *)*plVar1);
  *plVar1 = 0;
  *(undefined4 *)(plVar1 + 0x107) = 0;
  proxy_log(ph,LOG_LEVEL_DEBUG,"Closing listening connection...\n");
  conn_close((conn_handle *)(plVar1 + 0x108));
  proxy_log(ph,LOG_LEVEL_DEBUG,"Proxy is down - closing log.\n");
  log_close((log_handle *)(plVar1 + 0x10c));
  return;
}

Assistant:

void proxy_close(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int i;
	int ret;

	ret = registration_service_stop(&priv->reg_service);
	if (ret < 0)
		proxy_log(ph, LOG_LEVEL_ERROR,
			  "Failed to stop registration service (%d): %s\n",
			  -ret, strerror(-ret));

	proxy_shutdown(ph);
	proxy_drop(ph);

	proxy_log(ph, LOG_LEVEL_DEBUG, "Closing client connections...\n");

	priv->idle_workers_head = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_worker_free(&priv->client_workers[i]);

	memset(priv->clients_by_call, 0x0, sizeof(priv->clients_by_call));
	priv->idle_clients_head = NULL;
	priv->idle_clients_tail_ptr = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_conn_free(&priv->clients[i]);

	free(priv->client_workers);
	priv->client_workers = NULL;
	free(priv->clients);
	priv->clients = NULL;
	priv->num_clients = 0;

	proxy_log(ph, LOG_LEVEL_DEBUG, "Closing listening connection...\n");

	conn_close(&priv->conn_listen);

	proxy_log(ph, LOG_LEVEL_DEBUG, "Proxy is down - closing log.\n");

	log_close(&priv->log);
}